

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O2

void __thiscall wasm::SSAify::runOnFunction(SSAify *this,Module *module_,Function *func_)

{
  ReFinalize local_298;
  undefined1 local_130 [8];
  LocalGraph graph;
  
  this->module = module_;
  this->func = func_;
  LocalGraph::LocalGraph((LocalGraph *)local_130,func_,module_);
  LocalGraph::computeSetInfluences((LocalGraph *)local_130);
  LocalGraph::computeSSAIndexes((LocalGraph *)local_130);
  createNewIndexes(this,(LocalGraph *)local_130);
  computeGetsAndPhis(this,(LocalGraph *)local_130);
  addPrepends(this);
  if (this->refinalize == true) {
    ReFinalize::ReFinalize(&local_298);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_298.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               this->func,this->module);
    ReFinalize::~ReFinalize(&local_298);
  }
  LocalGraph::~LocalGraph((LocalGraph *)local_130);
  return;
}

Assistant:

void runOnFunction(Module* module_, Function* func_) override {
    module = module_;
    func = func_;
    LocalGraph graph(func, module);
    graph.computeSetInfluences();
    graph.computeSSAIndexes();
    // create new local indexes, one for each set
    createNewIndexes(graph);
    // we now know the sets for each get, and can compute get indexes and handle
    // phis
    computeGetsAndPhis(graph);
    // add prepends to function
    addPrepends();

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, module);
    }
  }